

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O0

void __thiscall CDirectiveData::writeSymData(CDirectiveData *this,SymbolData *symData)

{
  int64_t iVar1;
  size_t sVar2;
  SymbolData *symData_local;
  CDirectiveData *this_local;
  
  switch(this->mode) {
  case Invalid:
    break;
  case U8:
  case Sjis:
  case Custom:
    iVar1 = this->position;
    sVar2 = getDataSize(this);
    SymbolData::addData(symData,iVar1,sVar2,Data8);
    break;
  case U16:
    iVar1 = this->position;
    sVar2 = getDataSize(this);
    SymbolData::addData(symData,iVar1,sVar2,Data16);
    break;
  case U32:
  case Float:
    iVar1 = this->position;
    sVar2 = getDataSize(this);
    SymbolData::addData(symData,iVar1,sVar2,Data32);
    break;
  case U64:
  case Double:
    iVar1 = this->position;
    sVar2 = getDataSize(this);
    SymbolData::addData(symData,iVar1,sVar2,Data64);
    break;
  case Ascii:
    iVar1 = this->position;
    sVar2 = getDataSize(this);
    SymbolData::addData(symData,iVar1,sVar2,DataAscii);
  }
  return;
}

Assistant:

void CDirectiveData::writeSymData(SymbolData& symData) const
{
	switch (mode)
	{
	case EncodingMode::Ascii:
		symData.addData(position,getDataSize(),SymbolData::DataAscii);
		break;
	case EncodingMode::U8:
	case EncodingMode::Sjis:
	case EncodingMode::Custom:
		symData.addData(position,getDataSize(),SymbolData::Data8);
		break;
	case EncodingMode::U16:
		symData.addData(position,getDataSize(),SymbolData::Data16);
		break;
	case EncodingMode::U32:
	case EncodingMode::Float:
		symData.addData(position,getDataSize(),SymbolData::Data32);
		break;
	case EncodingMode::U64:
	case EncodingMode::Double:
		symData.addData(position,getDataSize(),SymbolData::Data64);
		break;
	case EncodingMode::Invalid:
		// TODO: Assert?
		break;
	}
}